

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryMatchesStop(Mio_Library_t *pLib)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Mem_t *pVVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  if (pLib->vTtMem == (Vec_Mem_t *)0x0) {
    return;
  }
  __ptr = pLib->vTt2Match;
  iVar2 = __ptr->nCap;
  pVVar3 = __ptr->pArray;
  if (iVar2 < 1) {
    if (pVVar3 != (Vec_Int_t *)0x0) goto LAB_003dd813;
  }
  else {
    lVar5 = 8;
    lVar4 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar3->nCap + lVar5);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar3 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar3->nCap + lVar5) = 0;
        iVar2 = __ptr->nCap;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < iVar2);
LAB_003dd813:
    free(pVVar3);
  }
  free(__ptr);
  pVVar1 = pLib->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) goto LAB_003dd8a4;
  pVVar3 = pVVar1->vTable;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar3 = pVVar1->vTable;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_003dd868;
    }
    free(pVVar3);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_003dd868:
  pVVar3 = pVVar1->vNexts;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar3 = pVVar1->vNexts;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_003dd8a4;
    }
    free(pVVar3);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_003dd8a4:
  pVVar1 = pLib->vTtMem;
  iVar2 = pVVar1->iPage;
  if (-1 < iVar2) {
    lVar4 = -1;
    do {
      if (pVVar1->ppPages[lVar4 + 1] != (word *)0x0) {
        free(pVVar1->ppPages[lVar4 + 1]);
        pVVar1->ppPages[lVar4 + 1] = (word *)0x0;
        iVar2 = pVVar1->iPage;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if (pVVar1->ppPages != (word **)0x0) {
    free(pVVar1->ppPages);
  }
  free(pVVar1);
  if (pLib->pCells != (Mio_Cell2_t *)0x0) {
    free(pLib->pCells);
    pLib->pCells = (Mio_Cell2_t *)0x0;
  }
  return;
}

Assistant:

void Mio_LibraryMatchesStop( Mio_Library_t * pLib )
{
    if ( !pLib->vTtMem )
        return;
    Vec_WecFree( pLib->vTt2Match );
    Vec_MemHashFree( pLib->vTtMem );
    Vec_MemFree( pLib->vTtMem );
    ABC_FREE( pLib->pCells );
}